

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O3

void __thiscall
QAnimationTimer::registerRunningAnimation(QAnimationTimer *this,QAbstractAnimation *animation)

{
  QObjectData *pQVar1;
  long in_FS_OFFSET;
  QAbstractAnimation *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (animation->super_QObject).d_ptr.d;
  if (*(char *)((long)&pQVar1[1].bindingStorage.d + 3) == '\0') {
    if (*(char *)((long)&pQVar1[1].bindingStorage.d + 2) == '\x01') {
      local_18 = animation;
      QtPrivate::QPodArrayOps<QAbstractAnimation*>::emplace<QAbstractAnimation*&>
                ((QPodArrayOps<QAbstractAnimation*> *)(this + 0x60),*(qsizetype *)(this + 0x70),
                 &local_18);
      QList<QAbstractAnimation_*>::end((QList<QAbstractAnimation_*> *)(this + 0x60));
    }
    else {
      *(int *)(this + 0x58) = *(int *)(this + 0x58) + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAnimationTimer::registerRunningAnimation(QAbstractAnimation *animation)
{
    if (QAbstractAnimationPrivate::get(animation)->isGroup)
        return;

    if (QAbstractAnimationPrivate::get(animation)->isPause) {
        runningPauseAnimations << animation;
    } else
        runningLeafAnimations++;
}